

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_GeometryShop.H
# Opt level: O1

int __thiscall
amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>::getBoxType_Cpu
          (GeometryShop<amrex::EB2::ParserIF,_amrex::Parser> *this,Box *bx,Geometry *geom)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Real RVar12;
  int local_4c;
  int local_48;
  
  iVar4 = ((bx->bigend).vect[2] - (bx->smallend).vect[2]) + 1;
  bVar2 = 0 < iVar4;
  if (iVar4 < 1) {
    uVar8 = 0xffffffff;
  }
  else {
    iVar5 = ((bx->bigend).vect[0] - (bx->smallend).vect[0]) + 1;
    iVar7 = ((bx->bigend).vect[1] - (bx->smallend).vect[1]) + 1;
    local_48 = 0;
    local_4c = 0;
    iVar9 = 0;
    do {
      bVar3 = 0 < iVar7;
      if (0 < iVar7) {
        iVar11 = 0;
        do {
          bVar1 = 0 < iVar5;
          if (0 < iVar5) {
            iVar10 = 0;
            do {
              RVar12 = ParserIF::operator()
                                 (&this->m_f,
                                  (double)((bx->smallend).vect[0] + iVar10) *
                                  (geom->super_CoordSys).dx[0] + (geom->prob_domain).xlo[0],
                                  (double)((bx->smallend).vect[1] + iVar11) *
                                  (geom->super_CoordSys).dx[1] + (geom->prob_domain).xlo[1],
                                  (double)((bx->smallend).vect[2] + local_48) *
                                  (geom->super_CoordSys).dx[2] + (geom->prob_domain).xlo[2]);
              if ((RVar12 != 0.0) || (NAN(RVar12))) {
                if (RVar12 <= 0.0) {
                  local_4c = local_4c + 1;
                }
                else {
                  iVar9 = iVar9 + 1;
                }
              }
              if ((0 < iVar9) && (0 < local_4c)) break;
              iVar10 = iVar10 + 1;
              bVar1 = iVar10 < iVar5;
            } while (iVar10 != iVar5);
          }
          if (bVar1) break;
          iVar11 = iVar11 + 1;
          bVar3 = iVar11 < iVar7;
        } while (iVar11 != iVar7);
      }
      if (bVar3) break;
      local_48 = local_48 + 1;
      bVar2 = local_48 < iVar4;
    } while (local_48 != iVar4);
    uVar8 = -(uint)(iVar9 == 0) | (uint)(local_4c == 0);
  }
  uVar6 = 0;
  if (!bVar2) {
    uVar6 = uVar8;
  }
  return uVar6;
}

Assistant:

int getBoxType_Cpu (const Box& bx, Geometry const& geom) const noexcept
    {
        const Real* problo = geom.ProbLo();
        const Real* dx = geom.CellSize();
        const auto& len3 = bx.length3d();
        const int* blo = bx.loVect();
        int nbody = 0, nzero = 0, nfluid = 0;
        for         (int k = 0; k < len3[2]; ++k) {
            for     (int j = 0; j < len3[1]; ++j) {
                for (int i = 0; i < len3[0]; ++i) {
                    RealArray xyz {AMREX_D_DECL(problo[0]+(i+blo[0])*dx[0],
                                                problo[1]+(j+blo[1])*dx[1],
                                                problo[2]+(k+blo[2])*dx[2])};
                    Real v = m_f(xyz);
                    if (v == 0.0_rt) {
                        ++nzero;
                    } else if (v > 0.0_rt) {
                        ++nbody;
                    } else {
                        ++nfluid;
                    }
                    if (nbody > 0 && nfluid > 0) return mixedcells;
                }
            }
        }

        if (nbody == 0) {
            return allregular;
        } else if (nfluid == 0) {
            return allcovered;
        } else {
            return mixedcells;
        }
    }